

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void R_InitColumnDrawers(void)

{
  R_DrawColumnHoriz = R_DrawColumnHorizP_C;
  R_DrawColumn = R_DrawColumnP_C;
  R_DrawFuzzColumn = R_DrawFuzzColumnP_C;
  R_DrawTranslatedColumn = R_DrawTranslatedColumnP_C;
  R_DrawShadedColumn = R_DrawShadedColumnP_C;
  R_DrawSpan = R_DrawSpanP_C;
  R_DrawSpanMasked = R_DrawSpanMaskedP_C;
  rt_map4cols = rt_map4cols_c;
  R_DrawSpanTranslucent = R_DrawSpanTranslucentP_C;
  R_DrawSpanMaskedTranslucent = R_DrawSpanMaskedTranslucentP_C;
  R_DrawSpanAddClamp = R_DrawSpanAddClampP_C;
  R_DrawSpanMaskedAddClamp = R_DrawSpanMaskedAddClampP_C;
  return;
}

Assistant:

void R_InitColumnDrawers ()
{
#ifdef X86_ASM
	R_DrawColumn				= R_DrawColumnP_ASM;
	R_DrawColumnHoriz			= R_DrawColumnHorizP_ASM;
	R_DrawFuzzColumn			= R_DrawFuzzColumnP_ASM;
	R_DrawTranslatedColumn		= R_DrawTranslatedColumnP_C;
	R_DrawShadedColumn			= R_DrawShadedColumnP_C;
	R_DrawSpan					= R_DrawSpanP_ASM;
	R_DrawSpanMasked			= R_DrawSpanMaskedP_ASM;
	if (CPU.Family <= 5)
	{
		rt_map4cols				= rt_map4cols_asm2;
	}
	else
	{
		rt_map4cols				= rt_map4cols_asm1;
	}
#else
	R_DrawColumnHoriz			= R_DrawColumnHorizP_C;
	R_DrawColumn				= R_DrawColumnP_C;
	R_DrawFuzzColumn			= R_DrawFuzzColumnP_C;
	R_DrawTranslatedColumn		= R_DrawTranslatedColumnP_C;
	R_DrawShadedColumn			= R_DrawShadedColumnP_C;
	R_DrawSpan					= R_DrawSpanP_C;
	R_DrawSpanMasked			= R_DrawSpanMaskedP_C;
	rt_map4cols					= rt_map4cols_c;
#endif
	R_DrawSpanTranslucent		= R_DrawSpanTranslucentP_C;
	R_DrawSpanMaskedTranslucent = R_DrawSpanMaskedTranslucentP_C;
	R_DrawSpanAddClamp			= R_DrawSpanAddClampP_C;
	R_DrawSpanMaskedAddClamp	= R_DrawSpanMaskedAddClampP_C;
}